

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_unbound_relationship_equal(mg_unbound_relationship *lhs,mg_unbound_relationship *rhs)

{
  uint uVar1;
  int iVar2;
  
  if (lhs->id == rhs->id) {
    uVar1 = lhs->type->size;
    if (uVar1 == rhs->type->size) {
      iVar2 = bcmp(lhs->type->data,rhs->type->data,(ulong)uVar1);
      if (iVar2 == 0) {
        iVar2 = mg_map_equal(lhs->properties,rhs->properties);
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

int mg_unbound_relationship_equal(const mg_unbound_relationship *lhs,
                                  const mg_unbound_relationship *rhs) {
  if (lhs->id != rhs->id) {
    return 0;
  }
  if (!mg_string_equal(lhs->type, rhs->type)) {
    return 0;
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}